

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zetMetricCreateFromProgrammableExp2
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t parameterCount,
          zet_metric_programmable_param_value_exp_t *pParameterValues,char *pName,char *pDescription
          ,uint32_t *pMetricHandleCount,zet_metric_handle_t *phMetricHandles)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  bool bVar6;
  ulong local_c0;
  size_t i_2;
  size_type sStack_b0;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zet_pfnMetricCreateFromProgrammableExp2_t pfnCreateFromProgrammableExp2;
  allocator local_69;
  string local_68 [32];
  uint *local_48;
  uint32_t *pMetricHandleCount_local;
  char *pDescription_local;
  char *pName_local;
  zet_metric_programmable_param_value_exp_t *pParameterValues_local;
  zet_metric_programmable_exp_handle_t p_Stack_20;
  uint32_t parameterCount_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  local_48 = pMetricHandleCount;
  pMetricHandleCount_local = (uint32_t *)pDescription;
  pDescription_local = pName;
  pName_local = (char *)pParameterValues;
  pParameterValues_local._4_4_ = parameterCount;
  p_Stack_20 = hMetricProgrammable;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)"
             ,&local_69);
  loader::Logger::log_trace(this,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar1 = *(code **)(context + 0x750);
  if (pcVar1 == (code *)0x0) {
    hMetricProgrammable_local._4_4_ =
         logAndPropagateResult
                   ("zetMetricCreateFromProgrammableExp2",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x78])
                        ((*ppvVar4)->zetValidation,p_Stack_20,(ulong)pParameterValues_local._4_4_,
                         pName_local,pDescription_local,pMetricHandleCount_local,local_48,
                         phMetricHandles);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZETHandleLifetimeValidation::zetMetricCreateFromProgrammableExp2Prologue
                        (&pHVar5->zetHandleLifetime,p_Stack_20,pParameterValues_local._4_4_,
                         (zet_metric_programmable_param_value_exp_t *)pName_local,pDescription_local
                         ,(char *)pMetricHandleCount_local,local_48,phMetricHandles);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(p_Stack_20,pParameterValues_local._4_4_,pName_local,pDescription_local,
                      pMetricHandleCount_local,local_48,phMetricHandles);
    for (sStack_b0 = 0; sStack_b0 < sVar3; sStack_b0 = sStack_b0 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_b0);
      result_00 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x79])
                            ((*ppvVar4)->zetValidation,p_Stack_20,
                             (ulong)pParameterValues_local._4_4_,pName_local,pDescription_local,
                             pMetricHandleCount_local,local_48,phMetricHandles,zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetMetricCreateFromProgrammableExp2",result_00);
        return zVar2;
      }
    }
    if ((zVar2 == ZE_RESULT_SUCCESS) && ((*(byte *)(context + 4) & 1) != 0)) {
      local_c0 = 0;
      while( true ) {
        bVar6 = false;
        if (phMetricHandles != (zet_metric_handle_t *)0x0) {
          bVar6 = local_c0 < *local_48;
        }
        if (!bVar6) break;
        if (phMetricHandles[local_c0] != (zet_metric_handle_t)0x0) {
          pHVar5 = std::
                   unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                   ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                                 *)(context + 0xd48));
          HandleLifetimeValidation::addHandle(pHVar5,phMetricHandles[local_c0]);
          pHVar5 = std::
                   unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                   ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                                 *)(context + 0xd48));
          HandleLifetimeValidation::addDependent(pHVar5,p_Stack_20,phMetricHandles[local_c0]);
        }
        local_c0 = local_c0 + 1;
      }
    }
    hMetricProgrammable_local._4_4_ =
         logAndPropagateResult("zetMetricCreateFromProgrammableExp2",zVar2);
  }
  return hMetricProgrammable_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp2(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        context.logger->log_trace("zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)");

        auto pfnCreateFromProgrammableExp2 = context.zetDdiTable.MetricExp.pfnCreateFromProgrammableExp2;

        if( nullptr == pfnCreateFromProgrammableExp2 )
            return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }

        auto driver_result = pfnCreateFromProgrammableExp2( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Epilogue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phMetricHandles) && (i < *pMetricHandleCount); ++i){
                if (phMetricHandles[i]){
                    context.handleLifetime->addHandle( phMetricHandles[i] );
                    context.handleLifetime->addDependent( hMetricProgrammable, phMetricHandles[i] );
                }
            }
        }
        return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", driver_result);
    }